

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O2

void __thiscall
gss::innards::Proof::mcs_bound
          (Proof *this,
          vector<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
          *partitions)

{
  long *plVar1;
  pointer ppVar2;
  unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  uVar3;
  _Head_base<0UL,_gss::innards::Proof::Imp_*,_false> _Var4;
  pointer pbVar5;
  _Base_ptr p_Var6;
  ostream *poVar7;
  _Rb_tree_node_base *p_Var8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  type *__range3;
  long __val;
  bool bVar9;
  pointer ppVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  pointer pbVar11;
  vector<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  to_sum;
  string local_50;
  
  std::operator<<((ostream *)
                  (((this->_imp)._M_t.
                    super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                    .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                  proof_stream)._M_t,"* failed bound\n");
  ppVar10 = (partitions->
            super__Vector_base<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (((this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->recover_encoding ==
      true) {
    ppVar2 = (partitions->
             super__Vector_base<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (; ppVar10 != ppVar2; ppVar10 = ppVar10 + 1) {
      for (p_Var6 = (ppVar10->second)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var6 != &(ppVar10->second)._M_t._M_impl.super__Rb_tree_header;
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
        recover_injectivity_constraint(this,p_Var6[1]._M_color);
      }
      for (p_Var6 = (ppVar10->first)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var6 != &(ppVar10->first)._M_t._M_impl.super__Rb_tree_header;
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
        recover_at_least_one_constraint(this,p_Var6[1]._M_color);
      }
    }
    ppVar10 = (partitions->
              super__Vector_base<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
  }
  to_sum.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  to_sum.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  to_sum.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ppVar2 = (partitions->
           super__Vector_base<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (; ppVar10 != ppVar2; ppVar10 = ppVar10 + 1) {
    if ((ppVar10->second)._M_t._M_impl.super__Rb_tree_header._M_node_count <
        (ppVar10->first)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
      std::operator<<((ostream *)
                      (((this->_imp)._M_t.
                        super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                        .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                      proof_stream)._M_t,"p");
      p_Var8 = (ppVar10->first)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      bVar9 = true;
      while ((_Rb_tree_header *)p_Var8 != &(ppVar10->first)._M_t._M_impl.super__Rb_tree_header) {
        poVar7 = std::operator<<((ostream *)
                                 (((this->_imp)._M_t.
                                   super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                   .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                  _M_head_impl)->proof_stream)._M_t," ");
        local_50._M_dataplus._M_p = (pointer)(long)(int)p_Var8[1]._M_color;
        std::
        map<long,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::operator[](&((this->_imp)._M_t.
                       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                      at_least_one_value_constraints,(key_type_conflict *)&local_50);
        std::ostream::_M_insert<long>((long)poVar7);
        if (!bVar9) {
          std::operator<<((ostream *)
                          (((this->_imp)._M_t.
                            super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                            .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)
                          ->proof_stream)._M_t," +");
        }
        p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
        bVar9 = false;
      }
      for (p_Var8 = (ppVar10->second)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          uVar3._M_t.
          super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
          .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
          _M_head_impl = (((this->_imp)._M_t.
                           super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                           .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                         proof_stream)._M_t,
          (_Rb_tree_header *)p_Var8 != &(ppVar10->second)._M_t._M_impl.super__Rb_tree_header;
          p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
        poVar7 = std::operator<<((ostream *)
                                 uVar3._M_t.
                                 super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                                 ._M_head_impl," ");
        local_50._M_dataplus._M_p = (pointer)(long)(int)p_Var8[1]._M_color;
        std::
        map<long,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::operator[](&((this->_imp)._M_t.
                       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                      injectivity_constraints,(key_type_conflict *)&local_50);
        poVar7 = std::ostream::_M_insert<long>((long)poVar7);
        std::operator<<(poVar7," +");
      }
      std::operator<<((ostream *)
                      uVar3._M_t.
                      super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                      ._M_head_impl,'\n');
      _Var4._M_head_impl =
           (this->_imp)._M_t.
           super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ._M_t.
           super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
           .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
      __val = (_Var4._M_head_impl)->proof_line + 1;
      (_Var4._M_head_impl)->proof_line = __val;
      std::__cxx11::to_string(&local_50,__val);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&to_sum,
                 &local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  if (to_sum.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      to_sum.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    poVar7 = std::operator<<((ostream *)
                             (((this->_imp)._M_t.
                               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                              _M_head_impl)->proof_stream)._M_t,"p ");
    std::ostream::_M_insert<long>((long)poVar7);
    pbVar5 = to_sum.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar11 = to_sum.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        uVar3._M_t.
        super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
        .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
        _M_head_impl = (((this->_imp)._M_t.
                         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                       proof_stream)._M_t, pbVar11 != pbVar5; pbVar11 = pbVar11 + 1) {
      poVar7 = std::operator<<((ostream *)
                               uVar3._M_t.
                               super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                               ._M_head_impl," ");
      poVar7 = std::operator<<(poVar7,(string *)pbVar11);
      std::operator<<(poVar7," +");
    }
    std::operator<<((ostream *)
                    uVar3._M_t.
                    super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                    ._M_head_impl,'\n');
    plVar1 = &((this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_line;
    *plVar1 = *plVar1 + 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&to_sum);
  return;
}

Assistant:

auto Proof::mcs_bound(
    const vector<pair<set<int>, set<int>>> & partitions) -> void
{
    *_imp->proof_stream << "* failed bound\n";

    if (_imp->recover_encoding) {
        for (auto & [l, r] : partitions) {
            for (auto & v : r)
                recover_injectivity_constraint(v);
            for (auto & v : l)
                recover_at_least_one_constraint(v);
        }
    }

    vector<string> to_sum;
    for (auto & [l, r] : partitions) {
        if (r.size() >= l.size())
            continue;

        *_imp->proof_stream << "p";
        bool first = true;
        for (auto & v : l) {
            *_imp->proof_stream << " " << get<1>(_imp->at_least_one_value_constraints[v]);
            if (first)
                first = false;
            else
                *_imp->proof_stream << " +";
        }
        for (auto & v : r)
            *_imp->proof_stream << " " << get<1>(_imp->injectivity_constraints[v]) << " +";

        *_imp->proof_stream << '\n';
        to_sum.push_back(to_string(++_imp->proof_line));
    }

    if (! to_sum.empty()) {
        *_imp->proof_stream << "p " << _imp->objective_line;
        for (auto & t : to_sum)
            *_imp->proof_stream << " " << t << " +";
        *_imp->proof_stream << '\n';
        ++_imp->proof_line;
    }
}